

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLQuaternion.cpp
# Opt level: O2

Quaternion * AML::unit(Quaternion *__return_storage_ptr__,Quaternion *rhs)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  
  dVar4 = norm(rhs);
  if (dVar4 <= 0.0) {
    dVar4 = (rhs->field_0).data[0];
    dVar2 = (rhs->field_0).data[1];
    dVar3 = (rhs->field_0).data[3];
    (__return_storage_ptr__->field_0).data[2] = (rhs->field_0).data[2];
    (__return_storage_ptr__->field_0).data[3] = dVar3;
    (__return_storage_ptr__->field_0).data[0] = dVar4;
    (__return_storage_ptr__->field_0).data[1] = dVar2;
  }
  else {
    auVar5._8_8_ = dVar4;
    auVar5._0_8_ = dVar4;
    auVar5 = divpd(*(undefined1 (*) [16])&rhs->field_0,auVar5);
    *(undefined1 (*) [16])&__return_storage_ptr__->field_0 = auVar5;
    auVar1._8_8_ = dVar4;
    auVar1._0_8_ = dVar4;
    auVar5 = divpd(*(undefined1 (*) [16])((long)&rhs->field_0 + 0x10),auVar1);
    *(undefined1 (*) [16])((long)&__return_storage_ptr__->field_0 + 0x10) = auVar5;
  }
  return __return_storage_ptr__;
}

Assistant:

Quaternion unit(const Quaternion& rhs)
    {
        double mag = norm(rhs);
        if (mag > 0.0)
        {
            return (Quaternion(rhs) / mag);
        }
        return Quaternion(rhs);
    }